

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_mesh_shader_features_nv
          (Impl *this,Value *state,VkPhysicalDeviceMeshShaderFeaturesNV **out_features)

{
  uint uVar1;
  VkPhysicalDeviceMeshShaderFeaturesNV *pVVar2;
  Type pGVar3;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkPhysicalDeviceMeshShaderFeaturesNV>
                     (&this->allocator);
  *out_features = pVVar2;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"taskShader");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->taskShader = uVar1;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"meshShader");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->meshShader = uVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_mesh_shader_features_nv(
		const Value &state,
		VkPhysicalDeviceMeshShaderFeaturesNV **out_features)
{
	auto *features = allocator.allocate_cleared<VkPhysicalDeviceMeshShaderFeaturesNV>();
	*out_features = features;

	features->taskShader = state["taskShader"].GetUint();
	features->meshShader = state["meshShader"].GetUint();
	return true;
}